

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::RegularExpression::matchAnchor
          (RegularExpression *this,Context *context,XMLInt32 ch,XMLSize_t offset)

{
  XMLCh XVar1;
  ulong uVar2;
  
  if ((short)ch == 0x5e) {
    uVar2 = context->fStart;
    if ((context->fOptions & 8) == 0) {
      if (uVar2 != offset) {
        return false;
      }
      return true;
    }
    if (uVar2 == offset) {
      return true;
    }
    if (offset <= uVar2) {
      return false;
    }
    XVar1 = context->fString[offset - 1];
    if ((ushort)XVar1 - 0x2028 < 2) {
      return true;
    }
    if (XVar1 == L'\r') {
      return true;
    }
  }
  else {
    if ((ch & 0xffffU) != 0x24) {
      return true;
    }
    uVar2 = context->fLimit;
    if ((context->fOptions & 8) != 0) {
      if (uVar2 == offset) {
        return true;
      }
      if (uVar2 <= offset) {
        return false;
      }
      XVar1 = context->fString[offset];
      if ((ushort)XVar1 - 0x2028 < 2) {
        return true;
      }
      if (XVar1 == L'\n') {
        return true;
      }
      if (XVar1 == L'\r') {
        return true;
      }
      return false;
    }
    if (uVar2 == offset) {
      return true;
    }
    if (offset + 1 == uVar2) {
      XVar1 = context->fString[offset];
      if ((ushort)XVar1 - 0x2028 < 2) {
        return true;
      }
      if (XVar1 == L'\n') {
        return true;
      }
      if (XVar1 == L'\r') {
        return true;
      }
    }
    if (offset + 2 != uVar2) {
      return false;
    }
    if (context->fString[offset] != L'\r') {
      return false;
    }
    XVar1 = context->fString[offset + 1];
  }
  if (XVar1 != L'\n') {
    return false;
  }
  return true;
}

Assistant:

bool RegularExpression::matchAnchor(Context* const context, const XMLInt32 ch,
                                    const XMLSize_t offset) const
{
    switch ((XMLCh) ch) {
    case chDollarSign:
        if (isSet(context->fOptions, MULTIPLE_LINE)) {
            if (!(offset == context->fLimit || (offset < context->fLimit
                && RegxUtil::isEOLChar(context->fString[offset]))))
                return false;
        }
        else {

            if (!(offset == context->fLimit
                || (offset+1 == context->fLimit
                    && RegxUtil::isEOLChar(context->fString[offset]))
                || (offset+2 == context->fLimit
                    && context->fString[offset] == chCR
                    && context->fString[offset+1] == chLF)))
                return false;
        }
        break;
    case chCaret:
        if (!isSet(context->fOptions, MULTIPLE_LINE)) {

            if (offset != context->fStart)
                return false;
        }
        else {

            if (!(offset == context->fStart || (offset > context->fStart
                && RegxUtil::isEOLChar(context->fString[offset-1]))))
                return false;
        }
        break;
    }

    return true;
}